

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_EditionDefaultsWithExtension_Test::TestBody
          (CommandLineInterfaceTest_EditionDefaultsWithExtension_Test *this)

{
  RepeatedPtrFieldBase *this_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>_>
  *pVVar1;
  MessageLite *pMVar2;
  FeatureSet *pFVar3;
  char *pcVar4;
  string_view name;
  string_view name_00;
  Metadata MVar5;
  string_view filename;
  string_view contents;
  string_view contents_00;
  FeatureSetDefaults defaults;
  AssertHelper local_90;
  Message local_88;
  internal local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  undefined1 local_70 [56];
  string local_38;
  
  MVar5 = DescriptorProto::GetMetadata((DescriptorProto *)_DescriptorProto_default_instance_);
  FileDescriptor::DebugString_abi_cxx11_((string *)local_70,(MVar5.descriptor)->file_);
  name._M_str = "google/protobuf/descriptor.proto";
  name._M_len = 0x20;
  contents._M_str = (char *)local_70._0_8_;
  contents._M_len = local_70._8_8_;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name,contents);
  if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  MVar5 = pb::TestFeatures::GetMetadata((TestFeatures *)pb::_TestFeatures_default_instance_);
  FileDescriptor::DebugString_abi_cxx11_((string *)local_70,(MVar5.descriptor)->file_);
  name_00._M_str = "features.proto";
  name_00._M_len = 0xe;
  contents_00._M_str = (char *)local_70._0_8_;
  contents_00._M_len = local_70._8_8_;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name_00,contents_00)
  ;
  if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "protocol_compiler --proto_path=$tmpdir --edition_defaults_out=$tmpdir/defaults --edition_defaults_maximum=99999_TEST_ONLY features.proto google/protobuf/descriptor.proto"
             ,"");
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  filename._M_str = "defaults";
  filename._M_len = 8;
  CommandLineInterfaceTest::ReadEditionDefaults
            ((FeatureSetDefaults *)local_70,&this->super_CommandLineInterfaceTest,filename);
  local_88.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = local_70._48_4_;
  local_90.data_._0_4_ = 0x3e6;
  testing::internal::CmpHelperEQ<google::protobuf::Edition,google::protobuf::Edition>
            (local_80,"defaults.minimum_edition()","EDITION_PROTO2",(Edition *)&local_88,
             (Edition *)&local_90);
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message(&local_88);
    if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar4 = (local_78->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
               ,0x8ae,pcVar4);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if ((long *)CONCAT44(local_88.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (int)local_88.ss_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_88.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (int)local_88.ss_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl) + 8))();
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  local_88.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = local_70._52_4_;
  local_90.data_._0_4_ = 99999;
  testing::internal::CmpHelperEQ<google::protobuf::Edition,google::protobuf::Edition>
            (local_80,"defaults.maximum_edition()","EDITION_99999_TEST_ONLY",(Edition *)&local_88,
             (Edition *)&local_90);
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message(&local_88);
    if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar4 = (local_78->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
               ,0x8af,pcVar4);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if ((long *)CONCAT44(local_88.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (int)local_88.ss_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_88.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (int)local_88.ss_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl) + 8))();
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  local_88.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = local_70._32_4_;
  local_90.data_._0_4_ = 7;
  testing::internal::CmpHelperEQ<int,int>
            (local_80,"defaults.defaults_size()","7",(int *)&local_88,(int *)&local_90);
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message(&local_88);
    if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar4 = (local_78->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
               ,0x8b0,pcVar4);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
  }
  else {
    if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_78,local_78);
    }
    this_00 = (RepeatedPtrFieldBase *)(local_70 + 0x18);
    pVVar1 = protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>>
                       (this_00,0);
    local_88.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = (pVVar1->field_0)._impl_.edition_;
    local_90.data_._0_4_ = 900;
    testing::internal::CmpHelperEQ<google::protobuf::Edition,google::protobuf::Edition>
              (local_80,"defaults.defaults(0).edition()","EDITION_LEGACY",(Edition *)&local_88,
               (Edition *)&local_90);
    if (local_80[0] == (internal)0x0) {
      testing::Message::Message(&local_88);
      if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar4 = (local_78->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                 ,0x8b1,pcVar4);
      testing::internal::AssertHelper::operator=(&local_90,&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      if ((long *)CONCAT44(local_88.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           (int)local_88.ss_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_88.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       (int)local_88.ss_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl) + 8))();
      }
    }
    if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_78,local_78);
    }
    pVVar1 = protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>>
                       (this_00,2);
    local_88.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = (pVVar1->field_0)._impl_.edition_;
    local_90.data_._0_4_ = 1000;
    testing::internal::CmpHelperEQ<google::protobuf::Edition,google::protobuf::Edition>
              (local_80,"defaults.defaults(2).edition()","EDITION_2023",(Edition *)&local_88,
               (Edition *)&local_90);
    if (local_80[0] == (internal)0x0) {
      testing::Message::Message(&local_88);
      if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar4 = (local_78->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                 ,0x8b2,pcVar4);
      testing::internal::AssertHelper::operator=(&local_90,&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      if ((long *)CONCAT44(local_88.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           (int)local_88.ss_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_88.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       (int)local_88.ss_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl) + 8))();
      }
    }
    if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_78,local_78);
    }
    pVVar1 = protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>>
                       (this_00,3);
    local_88.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = (pVVar1->field_0)._impl_.edition_;
    local_90.data_._0_4_ = 0x3e9;
    testing::internal::CmpHelperEQ<google::protobuf::Edition,google::protobuf::Edition>
              (local_80,"defaults.defaults(3).edition()","EDITION_2024",(Edition *)&local_88,
               (Edition *)&local_90);
    if (local_80[0] == (internal)0x0) {
      testing::Message::Message(&local_88);
      if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar4 = (local_78->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                 ,0x8b3,pcVar4);
      testing::internal::AssertHelper::operator=(&local_90,&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      if ((long *)CONCAT44(local_88.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           (int)local_88.ss_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_88.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       (int)local_88.ss_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl) + 8))();
      }
    }
    if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_78,local_78);
    }
    pVVar1 = protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>>
                       (this_00,4);
    local_88.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = (pVVar1->field_0)._impl_.edition_;
    local_90.data_._0_4_ = 0x1869d;
    testing::internal::CmpHelperEQ<google::protobuf::Edition,google::protobuf::Edition>
              (local_80,"defaults.defaults(4).edition()","EDITION_99997_TEST_ONLY",
               (Edition *)&local_88,(Edition *)&local_90);
    if (local_80[0] == (internal)0x0) {
      testing::Message::Message(&local_88);
      if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar4 = (local_78->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                 ,0x8b4,pcVar4);
      testing::internal::AssertHelper::operator=(&local_90,&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      if ((long *)CONCAT44(local_88.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           (int)local_88.ss_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_88.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       (int)local_88.ss_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl) + 8))();
      }
    }
    if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_78,local_78);
    }
    pVVar1 = protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>>
                       (this_00,5);
    local_88.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = (pVVar1->field_0)._impl_.edition_;
    local_90.data_._0_4_ = 0x1869e;
    testing::internal::CmpHelperEQ<google::protobuf::Edition,google::protobuf::Edition>
              (local_80,"defaults.defaults(5).edition()","EDITION_99998_TEST_ONLY",
               (Edition *)&local_88,(Edition *)&local_90);
    if (local_80[0] == (internal)0x0) {
      testing::Message::Message(&local_88);
      if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar4 = (local_78->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                 ,0x8b5,pcVar4);
      testing::internal::AssertHelper::operator=(&local_90,&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      if ((long *)CONCAT44(local_88.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           (int)local_88.ss_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_88.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       (int)local_88.ss_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl) + 8))();
      }
    }
    if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_78,local_78);
    }
    pVVar1 = protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>>
                       (this_00,0);
    pFVar3 = (pVVar1->field_0)._impl_.fixed_features_;
    if (pFVar3 == (FeatureSet *)0x0) {
      pFVar3 = (FeatureSet *)&_FeatureSet_default_instance_;
    }
    pMVar2 = protobuf::internal::ExtensionSet::GetMessage
                       (&(pFVar3->field_0)._impl_._extensions_,pb::test,
                        (MessageLite *)PTR__TestFeatures_default_instance__01970360);
    local_88.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = (int)pMVar2[1]._internal_metadata_.ptr_;
    local_90.data_._0_4_ = 1;
    testing::internal::CmpHelperEQ<pb::EnumFeature,pb::EnumFeature>
              (local_80,
               "defaults.defaults(0) .fixed_features() .GetExtension(pb::test) .file_feature()",
               "pb::EnumFeature::VALUE1",(EnumFeature *)&local_88,(EnumFeature *)&local_90);
    if (local_80[0] == (internal)0x0) {
      testing::Message::Message(&local_88);
      if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar4 = (local_78->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                 ,0x8ba,pcVar4);
      testing::internal::AssertHelper::operator=(&local_90,&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      if ((long *)CONCAT44(local_88.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           (int)local_88.ss_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_88.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       (int)local_88.ss_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl) + 8))();
      }
    }
    if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_78,local_78);
    }
    pVVar1 = protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>>
                       (this_00,2);
    pFVar3 = (pVVar1->field_0)._impl_.overridable_features_;
    if (pFVar3 == (FeatureSet *)0x0) {
      pFVar3 = (FeatureSet *)&_FeatureSet_default_instance_;
    }
    pMVar2 = protobuf::internal::ExtensionSet::GetMessage
                       (&(pFVar3->field_0)._impl_._extensions_,pb::test,
                        (MessageLite *)PTR__TestFeatures_default_instance__01970360);
    local_88.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = (int)pMVar2[1]._internal_metadata_.ptr_;
    local_90.data_._0_4_ = 3;
    testing::internal::CmpHelperEQ<pb::EnumFeature,pb::EnumFeature>
              (local_80,
               "defaults.defaults(2) .overridable_features() .GetExtension(pb::test) .file_feature()"
               ,"pb::EnumFeature::VALUE3",(EnumFeature *)&local_88,(EnumFeature *)&local_90);
    if (local_80[0] == (internal)0x0) {
      testing::Message::Message(&local_88);
      if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar4 = (local_78->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                 ,0x8bf,pcVar4);
      testing::internal::AssertHelper::operator=(&local_90,&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      if ((long *)CONCAT44(local_88.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           (int)local_88.ss_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_88.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       (int)local_88.ss_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl) + 8))();
      }
    }
    if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_78,local_78);
    }
    pVVar1 = protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>>
                       (this_00,3);
    pFVar3 = (pVVar1->field_0)._impl_.overridable_features_;
    if (pFVar3 == (FeatureSet *)0x0) {
      pFVar3 = (FeatureSet *)&_FeatureSet_default_instance_;
    }
    pMVar2 = protobuf::internal::ExtensionSet::GetMessage
                       (&(pFVar3->field_0)._impl_._extensions_,pb::test,
                        (MessageLite *)PTR__TestFeatures_default_instance__01970360);
    local_88.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = (int)pMVar2[1]._internal_metadata_.ptr_;
    local_90.data_._0_4_ = 3;
    testing::internal::CmpHelperEQ<pb::EnumFeature,pb::EnumFeature>
              (local_80,
               "defaults.defaults(3) .overridable_features() .GetExtension(pb::test) .file_feature()"
               ,"pb::EnumFeature::VALUE3",(EnumFeature *)&local_88,(EnumFeature *)&local_90);
    if (local_80[0] == (internal)0x0) {
      testing::Message::Message(&local_88);
      if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar4 = (local_78->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                 ,0x8c4,pcVar4);
      testing::internal::AssertHelper::operator=(&local_90,&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      if ((long *)CONCAT44(local_88.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           (int)local_88.ss_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_88.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       (int)local_88.ss_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl) + 8))();
      }
    }
    if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_78,local_78);
    }
    pVVar1 = protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>>
                       (this_00,4);
    pFVar3 = (pVVar1->field_0)._impl_.overridable_features_;
    if (pFVar3 == (FeatureSet *)0x0) {
      pFVar3 = (FeatureSet *)&_FeatureSet_default_instance_;
    }
    pMVar2 = protobuf::internal::ExtensionSet::GetMessage
                       (&(pFVar3->field_0)._impl_._extensions_,pb::test,
                        (MessageLite *)PTR__TestFeatures_default_instance__01970360);
    local_88.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = (int)pMVar2[1]._internal_metadata_.ptr_;
    local_90.data_._0_4_ = 4;
    testing::internal::CmpHelperEQ<pb::EnumFeature,pb::EnumFeature>
              (local_80,
               "defaults.defaults(4) .overridable_features() .GetExtension(pb::test) .file_feature()"
               ,"pb::EnumFeature::VALUE4",(EnumFeature *)&local_88,(EnumFeature *)&local_90);
    if (local_80[0] == (internal)0x0) {
      testing::Message::Message(&local_88);
      if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar4 = (local_78->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                 ,0x8c9,pcVar4);
      testing::internal::AssertHelper::operator=(&local_90,&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      if ((long *)CONCAT44(local_88.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           (int)local_88.ss_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_88.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       (int)local_88.ss_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl) + 8))();
      }
    }
    if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_78,local_78);
    }
    pVVar1 = protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>>
                       (this_00,5);
    pFVar3 = (pVVar1->field_0)._impl_.overridable_features_;
    if (pFVar3 == (FeatureSet *)0x0) {
      pFVar3 = (FeatureSet *)&_FeatureSet_default_instance_;
    }
    pMVar2 = protobuf::internal::ExtensionSet::GetMessage
                       (&(pFVar3->field_0)._impl_._extensions_,pb::test,
                        (MessageLite *)PTR__TestFeatures_default_instance__01970360);
    local_88.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = (int)pMVar2[1]._internal_metadata_.ptr_;
    local_90.data_._0_4_ = 5;
    testing::internal::CmpHelperEQ<pb::EnumFeature,pb::EnumFeature>
              (local_80,
               "defaults.defaults(5) .overridable_features() .GetExtension(pb::test) .file_feature()"
               ,"pb::EnumFeature::VALUE5",(EnumFeature *)&local_88,(EnumFeature *)&local_90);
    if (local_80[0] != (internal)0x0) goto LAB_00a0b9dc;
    testing::Message::Message(&local_88);
    if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar4 = (local_78->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
               ,0x8ce,pcVar4);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_90);
  if ((long *)CONCAT44(local_88.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._4_4_,
                       (int)local_88.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_88.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._4_4_,
                                   (int)local_88.ss_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl) + 8))();
  }
LAB_00a0b9dc:
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  FeatureSetDefaults::~FeatureSetDefaults((FeatureSetDefaults *)local_70);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, EditionDefaultsWithExtension) {
  CreateTempFile("google/protobuf/descriptor.proto",
                 google::protobuf::DescriptorProto::descriptor()->file()->DebugString());
  CreateTempFile("features.proto",
                 pb::TestFeatures::descriptor()->file()->DebugString());
  Run("protocol_compiler --proto_path=$tmpdir "
      "--edition_defaults_out=$tmpdir/defaults "
      "--edition_defaults_maximum=99999_TEST_ONLY "
      "features.proto google/protobuf/descriptor.proto");
  ExpectNoErrors();

  FeatureSetDefaults defaults = ReadEditionDefaults("defaults");
  EXPECT_EQ(defaults.minimum_edition(), EDITION_PROTO2);
  EXPECT_EQ(defaults.maximum_edition(), EDITION_99999_TEST_ONLY);
  ASSERT_EQ(defaults.defaults_size(), 7);
  EXPECT_EQ(defaults.defaults(0).edition(), EDITION_LEGACY);
  EXPECT_EQ(defaults.defaults(2).edition(), EDITION_2023);
  EXPECT_EQ(defaults.defaults(3).edition(), EDITION_2024);
  EXPECT_EQ(defaults.defaults(4).edition(), EDITION_99997_TEST_ONLY);
  EXPECT_EQ(defaults.defaults(5).edition(), EDITION_99998_TEST_ONLY);
  EXPECT_EQ(defaults.defaults(0)
                .fixed_features()
                .GetExtension(pb::test)
                .file_feature(),
            pb::EnumFeature::VALUE1);
  EXPECT_EQ(defaults.defaults(2)
                .overridable_features()
                .GetExtension(pb::test)
                .file_feature(),
            pb::EnumFeature::VALUE3);
  EXPECT_EQ(defaults.defaults(3)
                .overridable_features()
                .GetExtension(pb::test)
                .file_feature(),
            pb::EnumFeature::VALUE3);
  EXPECT_EQ(defaults.defaults(4)
                .overridable_features()
                .GetExtension(pb::test)
                .file_feature(),
            pb::EnumFeature::VALUE4);
  EXPECT_EQ(defaults.defaults(5)
                .overridable_features()
                .GetExtension(pb::test)
                .file_feature(),
            pb::EnumFeature::VALUE5);
}